

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::ScaleLayerParams::SharedDtor(ScaleLayerParams *this)

{
  if (this != (ScaleLayerParams *)&_ScaleLayerParams_default_instance_) {
    if (this->scale_ != (WeightParams *)0x0) {
      (*(this->scale_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if ((this != (ScaleLayerParams *)&_ScaleLayerParams_default_instance_) &&
       (this->bias_ != (WeightParams *)0x0)) {
      (*(this->bias_->super_MessageLite)._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void ScaleLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete scale_;
  }
  if (this != internal_default_instance()) {
    delete bias_;
  }
}